

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

SstStatusValue SstFFSPerformGets(SstStream Stream)

{
  void *pvVar1;
  SstFullMetadata p_Var2;
  void **ppvVar3;
  long *plVar4;
  size_t sVar5;
  size_t *SelectionCounts;
  int iVar6;
  SstStatusValue SVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  void *pvVar12;
  char *pcVar13;
  long lVar14;
  FFSVarRec_conflict pFVar15;
  _range_list *uncovered_list;
  size_t *psVar16;
  size_t *PartialOffsets;
  size_t *GlobalDims;
  size_t *psVar17;
  FFSArrayRequest_conflict Req;
  int *piVar18;
  FFSReaderMarshalBase *Info;
  size_t *__ptr;
  long lVar19;
  uint uVar20;
  long lVar21;
  undefined8 *puVar22;
  FFSArrayRequest *Req_00;
  ulong uVar23;
  FFSArrayRequest_conflict PrevReq;
  ulong uVar24;
  size_t sVar25;
  size_t *__ptr_00;
  FFSReaderMarshalBase *Info_1;
  long lVar26;
  undefined1 auVar27 [16];
  size_t *local_168;
  void *local_138 [33];
  
  pvVar1 = Stream->ReaderMarshalData;
  p_Var2 = Stream->CurrentMetadata;
  uVar20 = Stream->WriterCohortSize;
  uVar23 = (ulong)uVar20;
  for (Req = *(FFSArrayRequest_conflict *)((long)pvVar1 + 0x18);
      Req != (FFSArrayRequest_conflict)0x0; Req = Req->Next) {
    if (0 < (int)uVar20) {
      piVar18 = *(int **)((long)pvVar1 + 0x40);
      uVar24 = 0;
      do {
        if ((*piVar18 != 1) && (iVar6 = NeedWriter(Req,(int)uVar24), iVar6 != 0)) {
          *piVar18 = 1;
        }
        uVar24 = uVar24 + 1;
        piVar18 = piVar18 + 6;
      } while (uVar23 != uVar24);
    }
  }
  if (0 < (int)uVar20) {
    lVar14 = *(long *)((long)pvVar1 + 0x40);
    lVar26 = 0;
    lVar21 = 0;
    do {
      if (*(int *)(lVar14 + lVar26) == 1) {
        ppvVar3 = p_Var2->DP_TimestepInfo;
        if (ppvVar3 == (void **)0x0) {
          pvVar9 = (void *)0x0;
        }
        else {
          pvVar9 = ppvVar3[lVar21];
        }
        sVar25 = *(size_t *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + lVar21 * 8) + 0x10);
        pvVar8 = realloc(*(void **)(lVar14 + 8 + lVar26),sVar25);
        *(void **)(*(long *)((long)pvVar1 + 0x40) + 8 + lVar26) = pvVar8;
        memset(local_138,0,0x100);
        snprintf((char *)local_138,0x100,"Request to rank %d, bytes");
        if (_perfstubs_initialized == 1) {
          if (IssueReadRequests___var842 == 0) {
            IssueReadRequests___var842 = ps_create_counter_(local_138);
          }
          auVar27._8_4_ = (int)(sVar25 >> 0x20);
          auVar27._0_8_ = sVar25;
          auVar27._12_4_ = 0x45300000;
          ps_sample_counter_((auVar27._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)sVar25) - 4503599627370496.0),
                             IssueReadRequests___var842);
        }
        pvVar9 = SstReadRemoteMemory(Stream,(int)lVar21,Stream->ReaderTimestep,0,sVar25,
                                     *(void **)(*(long *)((long)pvVar1 + 0x40) + 8 + lVar26),pvVar9)
        ;
        lVar14 = *(long *)((long)pvVar1 + 0x40);
        *(void **)(lVar14 + 0x10 + lVar26) = pvVar9;
        *(undefined4 *)(lVar14 + lVar26) = 2;
        uVar23 = (ulong)(uint)Stream->WriterCohortSize;
      }
      lVar21 = lVar21 + 1;
      lVar26 = lVar26 + 0x18;
    } while (lVar21 < (int)uVar23);
    if (0 < (int)uVar23) {
      pvVar9 = Stream->ReaderMarshalData;
      uVar23 = 0;
      do {
        lVar14 = *(long *)((long)pvVar9 + 0x40);
        if (*(int *)(lVar14 + uVar23 * 0x18) == 2) {
          SVar7 = SstWaitForCompletion(Stream,*(void **)(lVar14 + uVar23 * 0x18 + 0x10));
          if (SVar7 != SstSuccess) {
            CP_verbose(Stream,CriticalVerbose,
                       "Wait for remote read completion failed, returning failure\n");
            CP_verbose(Stream,CriticalVerbose,
                       "Some memory read failed, not filling requests and returning failure\n");
            goto LAB_00116cc4;
          }
          *(undefined4 *)(*(long *)((long)pvVar9 + 0x40) + uVar23 * 0x18) = 3;
          if (Stream->ConfigParams->ReaderShortCircuitReads == 0) {
            pvVar8 = Stream->ReaderMarshalData;
            puVar22 = (undefined8 *)(*(long *)((long)pvVar8 + 0x40) + uVar23 * 0x18 + 8);
            uVar10 = FFSTypeHandle_from_encode(Stream->ReaderFFSContext,*puVar22);
            iVar6 = FFShas_conversion(uVar10);
            if (iVar6 == 0) {
              uVar11 = FMContext_from_FFS(Stream->ReaderFFSContext);
              uVar11 = FMformat_from_ID(uVar11,*puVar22);
              uVar11 = format_list_of_FMFormat(uVar11);
              uVar11 = FMcopy_struct_list(uVar11);
              FMlocalize_structs(uVar11);
              establish_conversion(Stream->ReaderFFSContext,uVar10,uVar11);
              FMfree_struct_list(uVar11);
            }
            iVar6 = FFSdecode_in_place_possible(uVar10);
            if (iVar6 == 0) {
              sVar25 = FFS_est_decode_length
                                 (Stream->ReaderFFSContext,*puVar22,
                                  *(undefined8 *)
                                   (*(long *)(*(long *)((long)pvVar8 + 0x20) + uVar23 * 8) + 0x10));
              pvVar12 = malloc(sVar25);
              local_138[0] = pvVar12;
              uVar11 = create_fixed_FFSBuffer(pvVar12,sVar25);
              FFSdecode_to_buffer(Stream->ReaderFFSContext,*puVar22,uVar11);
            }
            else {
              FFSdecode_in_place(Stream->ReaderFFSContext,*puVar22,local_138);
              pvVar12 = local_138[0];
            }
            pcVar13 = getenv("SstDumpData");
            if (pcVar13 != (char *)0x0) {
              printf("\nOn Rank %d, IncomingDatablock from writer %d is %p :\n",
                     (ulong)(uint)Stream->Rank,uVar23 & 0xffffffff,pvVar12);
              uVar11 = FMFormat_of_original(uVar10);
              FMdump_data(uVar11,local_138[0],0xfa000);
              pvVar12 = local_138[0];
            }
            *(void **)(*(long *)((long)pvVar8 + 0x30) + uVar23 * 8) = pvVar12;
            uVar10 = FMFormat_of_original(uVar10);
            lVar14 = format_list_of_FMFormat(uVar10);
            plVar4 = *(long **)(lVar14 + 8);
            *(long **)(*(long *)((long)pvVar8 + 0x38) + uVar23 * 8) = plVar4;
            if (*plVar4 != 0) {
              piVar18 = (int *)((long)plVar4 + 0x14);
              do {
                pFVar15 = LookupVarByName((SstStream)Stream->ReaderMarshalData,
                                          (char *)(*(long *)(piVar18 + 1) + 4));
                if (pFVar15 != (FFSVarRec_conflict)0x0) {
                  iVar6 = *piVar18;
                  pFVar15->PerWriterIncomingData[uVar23] =
                       *(void **)((long)local_138[0] + (long)iVar6 + 8);
                  pFVar15->PerWriterIncomingSize[uVar23] =
                       *(size_t *)((long)local_138[0] + (long)iVar6);
                }
                plVar4 = (long *)(piVar18 + 7);
                piVar18 = piVar18 + 0xc;
              } while (*plVar4 != 0);
            }
          }
        }
        uVar23 = uVar23 + 1;
      } while ((long)uVar23 < (long)Stream->WriterCohortSize);
    }
  }
  SVar7 = SstSuccess;
  CP_verbose(Stream,TraceVerbose,"All remote memory reads completed\n");
  if ((Stream->ConfigParams->ReaderShortCircuitReads == 0) &&
     (Req_00 = *(FFSArrayRequest **)((long)pvVar1 + 0x18), Req_00 != (FFSArrayRequest_conflict)0x0))
  {
    do {
      if ((Req_00->RequestType == Local) || (Req_00->VarRec->DimCount != 1)) {
LAB_00116a96:
        uVar23 = (ulong)(uint)Stream->WriterCohortSize;
      }
      else {
        uncovered_list = (_range_list *)malloc(0x18);
        uncovered_list->next = (_range_list *)0x0;
        psVar16 = Req_00->Start;
        sVar5 = *psVar16;
        uncovered_list->start = sVar5;
        psVar17 = Req_00->Count;
        uncovered_list->end = (sVar5 + *psVar17) - 1;
        if (Stream->WriterCohortSize < 1) {
LAB_00116a45:
          printf("WARNING:   Reader Rank %d requested elements %zu - %zu,\n\tbut these elements were not written by any writer rank: \n"
                 ,(ulong)(uint)Stream->Rank,*psVar16,*psVar16 + *psVar17 + -1);
          do {
            printf("%zd - %zd",uncovered_list->start,uncovered_list->end);
            if (uncovered_list->next == (_range_list *)0x0) break;
            printf(", ");
            uncovered_list = uncovered_list->next;
          } while (uncovered_list != (_range_list *)0x0);
          goto LAB_00116a96;
        }
        lVar14 = 0;
        do {
          sVar5 = *Req_00->VarRec->PerWriterStart[lVar14];
          uncovered_list =
               OneDCoverage(sVar5,(sVar5 + *Req_00->VarRec->PerWriterCounts[lVar14]) - 1,
                            uncovered_list);
          lVar14 = lVar14 + 1;
          uVar23 = (ulong)Stream->WriterCohortSize;
        } while (lVar14 < (long)uVar23);
        if (uncovered_list != (range_list)0x0) {
          psVar16 = Req_00->Start;
          psVar17 = Req_00->Count;
          goto LAB_00116a45;
        }
      }
      if (0 < (int)uVar23) {
        lVar14 = 0;
        do {
          iVar6 = NeedWriter(Req_00,(int)lVar14);
          if (iVar6 != 0) {
            pFVar15 = Req_00->VarRec;
            iVar6 = pFVar15->ElementSize;
            psVar16 = pFVar15->PerWriterCounts[lVar14];
            psVar17 = Req_00->Start;
            SelectionCounts = Req_00->Count;
            pcVar13 = (char *)pFVar15->PerWriterIncomingData[lVar14];
            uVar20 = (uint)pFVar15->DimCount;
            if (Req_00->RequestType == Local) {
              sVar25 = (size_t)(int)uVar20;
              if (Req_00->BlockID == pFVar15->PerWriterBlockStart[lVar14]) {
                lVar21 = 0;
              }
              else {
                lVar26 = 0;
                lVar21 = 0;
                do {
                  lVar19 = 1;
                  if (0 < (int)uVar20) {
                    uVar23 = 0;
                    do {
                      lVar19 = lVar19 * psVar16[uVar23];
                      uVar23 = uVar23 + 1;
                    } while ((uVar20 & 0x7fffffff) != uVar23);
                  }
                  lVar21 = lVar21 + lVar19 * iVar6;
                  psVar16 = psVar16 + sVar25;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != Req_00->BlockID - pFVar15->PerWriterBlockStart[lVar14]);
              }
              PartialOffsets = (size_t *)calloc(sVar25,8);
              GlobalDims = (size_t *)calloc(sVar25,8);
              if (psVar17 == (size_t *)0x0) {
                psVar17 = (size_t *)calloc(sVar25,8);
                __ptr_00 = psVar17;
              }
              else {
                __ptr_00 = (size_t *)0x0;
              }
              if (0 < (int)uVar20) {
                GlobalDims[lVar14] = psVar16[lVar14];
              }
              pcVar13 = pcVar13 + lVar21;
              __ptr = GlobalDims;
              local_168 = PartialOffsets;
            }
            else {
              GlobalDims = pFVar15->GlobalDims;
              PartialOffsets = pFVar15->PerWriterStart[lVar14];
              __ptr = (size_t *)0x0;
              local_168 = (size_t *)0x0;
              __ptr_00 = (size_t *)0x0;
            }
            if (Stream->ConfigParams->IsRowMajor == 0) {
              ExtractSelectionFromPartialCM
                        (iVar6,(long)(int)uVar20,GlobalDims,PartialOffsets,psVar16,psVar17,
                         SelectionCounts,pcVar13,(char *)Req_00->Data);
            }
            else {
              ExtractSelectionFromPartialRM
                        (iVar6,(long)(int)uVar20,GlobalDims,PartialOffsets,psVar16,psVar17,
                         SelectionCounts,pcVar13,(char *)Req_00->Data);
            }
            free(__ptr_00);
            free(__ptr);
            free(local_168);
            uVar23 = (ulong)(uint)Stream->WriterCohortSize;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)uVar23);
      }
      Req_00 = Req_00->Next;
    } while (Req_00 != (FFSArrayRequest *)0x0);
    SVar7 = SstSuccess;
  }
LAB_00116cc4:
  pvVar1 = Stream->ReaderMarshalData;
  pvVar9 = *(void **)((long)pvVar1 + 0x18);
  while (pvVar9 != (void *)0x0) {
    pvVar8 = *(void **)((long)pvVar9 + 0x30);
    free(*(void **)((long)pvVar9 + 0x20));
    free(*(void **)((long)pvVar9 + 0x18));
    free(pvVar9);
    pvVar9 = pvVar8;
  }
  *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  return SVar7;
}

Assistant:

extern SstStatusValue SstFFSPerformGets(SstStream Stream)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    SstStatusValue Ret;

    IssueReadRequests(Stream, Info->PendingVarRequests);

    Ret = WaitForReadRequests(Stream);

    if (Ret == SstSuccess)
    {
        if (!Stream->ConfigParams->ReaderShortCircuitReads)
            FillReadRequests(Stream, Info->PendingVarRequests);
    }
    else
    {
        CP_verbose(Stream, CriticalVerbose,
                   "Some memory read failed, not filling requests and "
                   "returning failure\n");
    }
    ClearReadRequests(Stream);

    return Ret;
}